

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.c
# Opt level: O0

pboolean p_tree_remove(PTree *tree,pconstpointer key)

{
  bool bVar1;
  pboolean result;
  pconstpointer key_local;
  PTree *tree_local;
  
  bVar1 = true;
  if (tree != (PTree *)0x0) {
    bVar1 = tree->root == (PTreeBaseNode *)0x0;
  }
  if (bVar1) {
    tree_local._4_4_ = 0;
  }
  else {
    tree_local._4_4_ =
         (*tree->remove_node_func)
                   (&tree->root,tree->compare_func,tree->data,tree->key_destroy_func,
                    tree->value_destroy_func,key);
    if (tree_local._4_4_ == 1) {
      tree->nnodes = tree->nnodes + -1;
    }
  }
  return tree_local._4_4_;
}

Assistant:

P_LIB_API pboolean
p_tree_remove (PTree		*tree,
	       pconstpointer	key)
{
	pboolean result;

	if (P_UNLIKELY (tree == NULL || tree->root == NULL))
		return FALSE;

	result = tree->remove_node_func (&tree->root,
					 tree->compare_func,
					 tree->data,
					 tree->key_destroy_func,
					 tree->value_destroy_func,
					 key);
	if (result == TRUE)
		--tree->nnodes;

	return result;
}